

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Mat *pMVar5;
  size_t sVar6;
  size_t *psVar7;
  int *piVar8;
  pointer pMVar9;
  byte bVar10;
  undefined4 *puVar11;
  int j;
  void *pvVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  void *pvVar19;
  int iVar20;
  uint uVar21;
  undefined4 *puVar22;
  int iVar23;
  void *pvVar24;
  int iVar25;
  undefined4 *puVar26;
  int iVar27;
  void *pvVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  size_t sVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  int local_c0;
  Mat local_88;
  uint local_3c;
  undefined8 local_38;
  
  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar9->dims;
  iVar2 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Concat_x86[-3]);
  if (uVar1 == 1) {
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar16 == 0) {
      uVar15 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar8 = &pMVar9->w;
      uVar15 = 0;
      do {
        uVar15 = uVar15 + piVar8[-5] * *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    bVar10 = (uVar15 & 3) == 0 & opt->use_packing_layout;
    iVar25 = (uint)bVar10 + (uint)bVar10 * 2 + 1;
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,(int)uVar15 / iVar25,
                pMVar9->elemsize / (ulong)(long)pMVar9->elempack << bVar10 * '\x02',iVar25,
                opt->blob_allocator);
    pvVar14 = pMVar5->data;
    if (pvVar14 == (void *)0x0) {
      bVar37 = true;
    }
    else {
      bVar37 = (long)pMVar5->c * pMVar5->cstep == 0;
    }
    if (bVar37) {
      return -100;
    }
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar9) {
      lVar16 = 0x2c;
      uVar31 = 0;
      do {
        memcpy(pvVar14,*(void **)((long)pMVar9 + lVar16 + -0x2c),
               (long)*(int *)((long)&pMVar9->data + lVar16) *
               *(long *)((long)pMVar9 + lVar16 + -0x1c));
        pvVar14 = (void *)((long)pvVar14 +
                          (long)*(int *)((long)pMVar9 + lVar16 + -0x14) *
                          (long)*(int *)((long)&pMVar9->data + lVar16) * 4);
        uVar31 = uVar31 + 1;
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = lVar16 + 0x48;
      } while (uVar31 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
  }
  uVar15 = (iVar2 >> 0x1f & uVar1) + iVar2;
  if ((uVar1 == 2) && (uVar15 == 0)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = pMVar9->w;
    uVar31 = pMVar9->elemsize;
    iVar25 = pMVar9->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar16 == 0) {
      uVar33 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar8 = &pMVar9->h;
      uVar33 = 0;
      do {
        if (*(ulong *)(piVar8 + -8) < uVar31) {
          uVar31 = *(ulong *)(piVar8 + -8);
        }
        iVar20 = piVar8[-6];
        if (iVar20 < iVar25) {
          iVar25 = iVar20;
        }
        uVar33 = uVar33 + iVar20 * *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    bVar10 = (uVar33 & 3) == 0 & opt->use_packing_layout;
    iVar20 = (uint)bVar10 + (uint)bVar10 * 2 + 1;
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,iVar2,(int)uVar33 / iVar20,uVar31 / (ulong)(long)iVar25 << bVar10 * '\x02',
                iVar20,opt->blob_allocator);
    if (pMVar5->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar5->c * pMVar5->cstep == 0) {
      return -100;
    }
    local_88.data = pMVar5->data;
    piVar8 = pMVar5->refcount;
    local_88.refcount._0_4_ = SUB84(piVar8,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)pMVar5->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(pMVar5->elemsize >> 0x20);
    local_88.elempack = pMVar5->elempack;
    local_88.allocator = pMVar5->allocator;
    local_88.dims = pMVar5->dims;
    local_88.w = pMVar5->w;
    local_88.h = pMVar5->h;
    local_88.d = pMVar5->d;
    local_88.c = pMVar5->c;
    local_88.cstep = pMVar5->cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    local_38 = pMVar5;
    if ((iVar25 < iVar20) &&
       ((Mat::create(&local_88,iVar2,(int)uVar33 / iVar25,uVar31,iVar25,opt->workspace_allocator),
        (undefined4 *)local_88.data == (undefined4 *)0x0 || ((long)local_88.c * local_88.cstep == 0)
        ))) {
      piVar8 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar8 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 != 0) {
        return -100;
      }
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      if ((undefined4 *)local_88.data == (undefined4 *)0x0) {
        return -100;
      }
      free(local_88.data);
      return -100;
    }
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar9) {
      lVar16 = (long)iVar2;
      uVar31 = 0;
      puVar11 = (undefined4 *)local_88.data;
      do {
        pMVar9 = pMVar9 + uVar31;
        iVar34 = pMVar9->elempack;
        if (((iVar34 == 4) && (iVar25 == 1)) && (iVar27 = pMVar9->h, 0 < (long)iVar27)) {
          pvVar14 = pMVar9->data;
          iVar3 = pMVar9->w;
          sVar32 = pMVar9->elemsize;
          lVar18 = 0;
          do {
            if (0 < iVar2) {
              puVar22 = (undefined4 *)((long)iVar3 * sVar32 * lVar18 + (long)pvVar14);
              puVar26 = puVar11;
              iVar23 = iVar2;
              do {
                *puVar26 = *puVar22;
                puVar26[lVar16] = puVar22[1];
                puVar26[iVar2 * 2] = puVar22[2];
                puVar26[iVar2 * 3] = puVar22[3];
                puVar26 = puVar26 + 1;
                puVar22 = puVar22 + 4;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            puVar11 = puVar11 + lVar16 * 4;
            lVar18 = lVar18 + 1;
          } while (lVar18 != iVar27);
        }
        if (iVar34 == iVar25) {
          lVar18 = pMVar9->h * lVar16;
          memcpy(puVar11,pMVar9->data,pMVar9->elemsize * lVar18);
          local_c0 = (int)lVar18;
          puVar11 = puVar11 + (long)local_c0 * (long)pMVar9->elempack;
        }
        uVar31 = uVar31 + 1;
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar31 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (iVar25 < iVar20) {
      convert_packing(&local_88,local_38,iVar20,opt);
    }
    piVar8 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
  }
  if ((uVar1 == 2) && (uVar15 == 1)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar33 = pMVar9->h;
    sVar32 = pMVar9->elemsize;
    iVar2 = pMVar9->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar16 == 0) {
      iVar25 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar8 = &pMVar9->w;
      iVar25 = 0;
      do {
        iVar25 = iVar25 + *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,iVar25,uVar33,sVar32,iVar2,opt->blob_allocator);
    if (pMVar5->data == (void *)0x0) {
      bVar37 = true;
    }
    else {
      bVar37 = (long)pMVar5->c * pMVar5->cstep == 0;
    }
    if (bVar37) {
      return -100;
    }
    if (0 < (int)uVar33) {
      uVar31 = 0;
      do {
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar9) {
          pvVar14 = (void *)((long)pMVar5->w * uVar31 * pMVar5->elemsize + (long)pMVar5->data);
          lVar16 = 0x2c;
          uVar35 = 0;
          do {
            lVar18 = (long)*(int *)((long)&pMVar9->data + lVar16);
            memcpy(pvVar14,(void *)(uVar31 * lVar18 * *(long *)((long)pMVar9 + lVar16 + -0x1c) +
                                   *(long *)((long)pMVar9 + lVar16 + -0x2c)),lVar18 * sVar32);
            pvVar14 = (void *)((long)pvVar14 +
                              (long)*(int *)((long)&pMVar9->data + lVar16) * (long)iVar2 * 4);
            uVar35 = uVar35 + 1;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x48;
          } while (uVar35 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != uVar33);
    }
    if (bVar37) {
      return -100;
    }
  }
  if ((uVar1 - 3 < 2) && (uVar15 == 0)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = pMVar9->w;
    iVar25 = pMVar9->h;
    iVar20 = pMVar9->d;
    sVar32 = pMVar9->elemsize;
    iVar34 = pMVar9->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar16 == 0) {
      uVar33 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      psVar7 = &pMVar9->elemsize;
      uVar33 = 0;
      do {
        if (*psVar7 < sVar32) {
          sVar32 = *psVar7;
        }
        iVar27 = *(int *)(psVar7 + 1);
        if (iVar27 < iVar34) {
          iVar34 = iVar27;
        }
        uVar33 = uVar33 + iVar27 * *(int *)(psVar7 + 5);
        psVar7 = psVar7 + 9;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    bVar10 = (uVar33 & 3) == 0 & opt->use_packing_layout;
    iVar27 = (uint)bVar10 + (uint)bVar10 * 2 + 1;
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,iVar2,iVar25,iVar20,(int)uVar33 / iVar27,
                sVar32 / (ulong)(long)iVar34 << bVar10 * '\x02',iVar27,opt->blob_allocator);
    if (pMVar5->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar5->c * pMVar5->cstep == 0) {
      return -100;
    }
    pMVar5->dims = uVar1;
    local_88.data = pMVar5->data;
    piVar8 = pMVar5->refcount;
    local_88.refcount._0_4_ = SUB84(piVar8,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)pMVar5->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(pMVar5->elemsize >> 0x20);
    local_88.elempack = pMVar5->elempack;
    local_88.allocator = pMVar5->allocator;
    local_88.dims = pMVar5->dims;
    local_88.w = pMVar5->w;
    local_88.h = pMVar5->h;
    local_88.d = pMVar5->d;
    local_88.c = pMVar5->c;
    local_88.cstep = pMVar5->cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    uVar21 = local_88.dims;
    if ((iVar34 < iVar27) &&
       ((Mat::create(&local_88,iVar2,iVar25,iVar20,(int)uVar33 / iVar34,sVar32,iVar34,
                     opt->workspace_allocator), local_88.data == (void *)0x0 ||
        (uVar21 = uVar1, (long)local_88.c * local_88.cstep == 0)))) {
      piVar8 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return -100;
    }
    local_88.dims = uVar21;
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar9) {
      uVar35 = 0;
      uVar31 = 0;
      do {
        pMVar9 = pMVar9 + uVar31;
        if (((pMVar9->elempack == 4) && (iVar34 == 1)) && (iVar2 = pMVar9->c, 0 < (long)iVar2)) {
          iVar25 = pMVar9->h * pMVar9->w * pMVar9->d;
          sVar32 = pMVar9->cstep;
          sVar6 = pMVar9->elemsize;
          pvVar14 = pMVar9->data;
          lVar18 = local_88.cstep * CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          uVar35 = (ulong)(int)uVar35;
          pvVar24 = (void *)((uVar35 + 3) * lVar18 + (long)local_88.data);
          lVar16 = lVar18 * 4;
          pvVar28 = (void *)((uVar35 + 2) * lVar18 + (long)local_88.data);
          pvVar12 = (void *)((uVar35 + 1) * lVar18 + (long)local_88.data);
          pvVar19 = (void *)(lVar18 * uVar35 + (long)local_88.data);
          lVar18 = 0;
          do {
            if (0 < iVar25) {
              puVar11 = (undefined4 *)(sVar32 * sVar6 * lVar18 + (long)pvVar14);
              lVar29 = 0;
              do {
                *(undefined4 *)((long)pvVar19 + lVar29 * 4) = *puVar11;
                *(undefined4 *)((long)pvVar12 + lVar29 * 4) = puVar11[1];
                *(undefined4 *)((long)pvVar28 + lVar29 * 4) = puVar11[2];
                *(undefined4 *)((long)pvVar24 + lVar29 * 4) = puVar11[3];
                puVar11 = puVar11 + 4;
                lVar29 = lVar29 + 1;
              } while (iVar25 != (int)lVar29);
            }
            uVar35 = uVar35 + 4;
            lVar18 = lVar18 + 1;
            pvVar24 = (void *)((long)pvVar24 + lVar16);
            pvVar28 = (void *)((long)pvVar28 + lVar16);
            pvVar12 = (void *)((long)pvVar12 + lVar16);
            pvVar19 = (void *)((long)pvVar19 + lVar16);
          } while (lVar18 != iVar2);
        }
        if (pMVar9->elempack == iVar34) {
          memcpy((void *)(local_88.cstep * (long)(int)uVar35 *
                          CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) +
                         (long)local_88.data),pMVar9->data,
                 (long)((int)pMVar9->cstep * pMVar9->c) * pMVar9->elemsize);
          uVar35 = (ulong)(uint)((int)uVar35 + pMVar9->c);
        }
        uVar31 = uVar31 + 1;
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar31 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (iVar34 < iVar27) {
      convert_packing(&local_88,pMVar5,iVar27,opt);
    }
    piVar8 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if (local_88.data != (void *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
  }
  uVar33 = uVar1 ^ 3;
  if ((uVar15 == 1 && uVar33 == 0) || (uVar21 = uVar15 ^ 2, uVar1 == 4 && (uVar15 ^ 2) == 0)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar21 = pMVar9->d;
    uVar4 = pMVar9->c;
    sVar32 = pMVar9->elemsize;
    iVar2 = pMVar9->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    local_38 = (Mat *)(CONCAT44(local_38._4_4_,uVar15) ^ 2);
    if (lVar16 == 0) {
      iVar25 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar8 = &pMVar9->h;
      iVar25 = 0;
      do {
        iVar25 = iVar25 + *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,pMVar9->w,iVar25,uVar21,uVar4,sVar32,iVar2,opt->blob_allocator);
    if (pMVar5->data == (void *)0x0) {
      bVar37 = true;
    }
    else {
      bVar37 = (long)pMVar5->c * pMVar5->cstep == 0;
    }
    if (bVar37) {
      return -100;
    }
    pMVar5->dims = uVar1;
    local_3c = uVar33;
    if (0 < (int)uVar4) {
      uVar31 = 0;
      do {
        if (0 < (int)uVar21) {
          pvVar14 = (void *)(pMVar5->cstep * uVar31 * pMVar5->elemsize + (long)pMVar5->data);
          uVar35 = 0;
          do {
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar9) {
              lVar16 = 0x40;
              uVar13 = 0;
              do {
                lVar29 = (long)*(int *)((long)pMVar9 + lVar16 + -0x14);
                lVar17 = (long)*(int *)((long)pMVar9 + lVar16 + -0x10);
                lVar18 = *(long *)((long)pMVar9 + lVar16 + -0x30);
                lVar30 = lVar17 * lVar29;
                memcpy(pvVar14,(void *)(lVar18 * lVar17 * uVar35 * lVar29 +
                                       *(long *)((long)&pMVar9->data + lVar16) * uVar31 * lVar18 +
                                       *(long *)((long)pMVar9 + lVar16 + -0x40)),lVar30 * sVar32);
                pvVar14 = (void *)((long)pvVar14 + (long)((int)lVar30 * iVar2) * 4);
                uVar13 = uVar13 + 1;
                pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar16 = lVar16 + 0x48;
              } while (uVar13 < (ulong)(((long)(bottom_blobs->
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 != uVar21);
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != uVar4);
    }
    uVar21 = (uint)local_38;
    uVar33 = local_3c;
    if (bVar37) {
      return -100;
    }
  }
  if ((uVar33 == 0 && uVar21 == 0) || (uVar1 == 4 && uVar15 == 3)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar33 = pMVar9->h;
    uVar21 = pMVar9->d;
    uVar4 = pMVar9->c;
    sVar32 = pMVar9->elemsize;
    iVar2 = pMVar9->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar16 == 0) {
      iVar25 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar8 = &pMVar9->w;
      iVar25 = 0;
      do {
        iVar25 = iVar25 + *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,iVar25,uVar33,uVar21,uVar4,sVar32,iVar2,opt->blob_allocator);
    if (pMVar5->data == (void *)0x0) {
      bVar37 = true;
    }
    else {
      bVar37 = (long)pMVar5->c * pMVar5->cstep == 0;
    }
    if (bVar37) {
      return -100;
    }
    local_3c = local_3c & 0xffffff00;
    pMVar5->dims = uVar1;
    local_38 = pMVar5;
    if (0 < (int)uVar4) {
      uVar31 = 0;
      do {
        if (0 < (int)uVar21) {
          pvVar14 = (void *)(local_38->cstep * uVar31 * local_38->elemsize + (long)local_38->data);
          uVar35 = 0;
          do {
            if (0 < (int)uVar33) {
              uVar13 = 0;
              do {
                pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish != pMVar9) {
                  lVar16 = 0x40;
                  uVar36 = 0;
                  do {
                    lVar29 = (long)*(int *)((long)pMVar9 + lVar16 + -0x14);
                    lVar18 = *(long *)((long)pMVar9 + lVar16 + -0x30);
                    lVar17 = lVar18 * lVar29;
                    memcpy(pvVar14,(void *)(lVar17 * uVar13 +
                                            (long)*(int *)((long)pMVar9 + lVar16 + -0x10) * uVar35 *
                                            lVar17 + *(long *)((long)&pMVar9->data + lVar16) *
                                                     uVar31 * lVar18 +
                                                     *(long *)((long)pMVar9 + lVar16 + -0x40)),
                           lVar29 * sVar32);
                    pvVar14 = (void *)((long)pvVar14 +
                                      (long)*(int *)((long)pMVar9 + lVar16 + -0x14) * (long)iVar2 *
                                      4);
                    uVar36 = uVar36 + 1;
                    pMVar9 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    lVar16 = lVar16 + 0x48;
                  } while (uVar36 < (ulong)(((long)(bottom_blobs->
                                                                                                      
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar33);
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 != uVar21);
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != uVar4);
    }
    if ((char)local_3c != '\0') {
      return -100;
    }
  }
  if ((uVar1 == 4) && (uVar15 == 1)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar9->c;
    sVar32 = pMVar9->elemsize;
    iVar2 = pMVar9->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar16 == 0) {
      iVar25 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar8 = &pMVar9->d;
      iVar25 = 0;
      do {
        iVar25 = iVar25 + *piVar8;
        piVar8 = piVar8 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar5,pMVar9->w,pMVar9->h,iVar25,uVar1,sVar32,iVar2,opt->blob_allocator);
    if (pMVar5->data == (void *)0x0) {
      bVar37 = true;
    }
    else {
      bVar37 = (long)pMVar5->c * pMVar5->cstep == 0;
    }
    if (bVar37) {
      return -100;
    }
    if (0 < (int)uVar1) {
      uVar31 = 0;
      do {
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar9) {
          pvVar14 = (void *)(pMVar5->cstep * uVar31 * pMVar5->elemsize + (long)pMVar5->data);
          lVar16 = 0x40;
          uVar35 = 0;
          do {
            lVar18 = (long)*(int *)((long)pMVar9 + lVar16 + -0xc) *
                     (long)*(int *)((long)pMVar9 + lVar16 + -0x10) *
                     (long)*(int *)((long)pMVar9 + lVar16 + -0x14);
            memcpy(pvVar14,(void *)(*(long *)((long)&pMVar9->data + lVar16) * uVar31 *
                                    *(long *)((long)pMVar9 + lVar16 + -0x30) +
                                   *(long *)((long)pMVar9 + lVar16 + -0x40)),lVar18 * sVar32);
            pvVar14 = (void *)((long)pvVar14 + (long)((int)lVar18 * iVar2) * 4);
            uVar35 = uVar35 + 1;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x48;
          } while (uVar35 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != uVar1);
    }
    if (bVar37) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, d, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;

            top_blob_unpacked.dims = dims;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const float* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elempack;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const float* ptr = bottom_blob.channel(q).depth(i).row(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elempack;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    return 0;
}